

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O3

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode>::~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_VRSpecificItemFactory<MinVR::VRDisplayNode>).super_VRItemFactory._vptr_VRItemFactory
       = (_func_int **)&PTR__VRSpecificItemFactory_00176448;
  pcVar2 = (this->super_VRSpecificItemFactory<MinVR::VRDisplayNode>)._typeName._M_dataplus._M_p;
  paVar1 = &(this->super_VRSpecificItemFactory<MinVR::VRDisplayNode>)._typeName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}